

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O0

Dim * __thiscall
cnn::InnerProduct3D_1D::dim_forward
          (InnerProduct3D_1D *this,vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  initializer_list<unsigned_int> x;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  size_type sVar4;
  invalid_argument *piVar5;
  const_reference pvVar6;
  uint *puVar7;
  ostream *ds;
  vector<cnn::Dim,_std::allocator<cnn::Dim>_> *in_RDX;
  Dim *in_RDI;
  ostringstream s_1;
  ostringstream s;
  Dim *in_stack_fffffffffffffc28;
  Dim *in_stack_fffffffffffffc30;
  ostringstream *poVar8;
  vector<cnn::Dim,_std::allocator<cnn::Dim>_> *in_stack_fffffffffffffc38;
  ostream *in_stack_fffffffffffffc40;
  Dim *in_stack_fffffffffffffc50;
  iterator in_stack_fffffffffffffc58;
  size_type in_stack_fffffffffffffc60;
  string local_370 [32];
  ostringstream local_350 [376];
  uint local_1d8;
  uint local_1d4;
  uint *local_1d0;
  undefined8 local_1c8;
  undefined1 local_1b9;
  string local_1b8 [32];
  ostringstream local_198 [392];
  vector<cnn::Dim,_std::allocator<cnn::Dim>_> *local_10;
  
  local_10 = in_RDX;
  sVar4 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::size(in_RDX);
  if ((sVar4 != 2) &&
     (sVar4 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::size(local_10), sVar4 != 3)) {
    piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar5,"Expected two or three arguments in InnerProduct3D_1D");
    __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  pvVar6 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](local_10,0);
  uVar2 = Dim::ndims(pvVar6);
  if (uVar2 == 3) {
    pvVar6 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](local_10,1);
    uVar2 = Dim::ndims(pvVar6);
    if (uVar2 == 1) {
      std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](local_10,0);
      uVar2 = Dim::size(in_stack_fffffffffffffc30,(uint)((ulong)in_stack_fffffffffffffc28 >> 0x20));
      std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](local_10,1);
      uVar3 = Dim::size(in_stack_fffffffffffffc30,(uint)((ulong)in_stack_fffffffffffffc28 >> 0x20));
      if (uVar2 == uVar3) {
        std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](local_10,0);
        local_1d8 = Dim::size(in_stack_fffffffffffffc30,
                              (uint)((ulong)in_stack_fffffffffffffc28 >> 0x20));
        std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](local_10,0);
        local_1d4 = Dim::size(in_stack_fffffffffffffc30,
                              (uint)((ulong)in_stack_fffffffffffffc28 >> 0x20));
        local_1d0 = &local_1d8;
        local_1c8 = 2;
        pvVar6 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](local_10,0);
        puVar7 = &pvVar6->bd;
        pvVar6 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](local_10,1);
        std::max<unsigned_int>(puVar7,&pvVar6->bd);
        x._M_len = in_stack_fffffffffffffc60;
        x._M_array = in_stack_fffffffffffffc58;
        Dim::Dim(in_stack_fffffffffffffc50,x,(uint)((ulong)puVar7 >> 0x20));
        sVar4 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::size(local_10);
        if (sVar4 == 3) {
          in_stack_fffffffffffffc40 = (ostream *)&in_RDI->bd;
          pvVar6 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](local_10,2);
          puVar7 = std::max<unsigned_int>((uint *)in_stack_fffffffffffffc40,&pvVar6->bd);
          in_RDI->bd = *puVar7;
        }
        sVar4 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::size(local_10);
        if (sVar4 == 3) {
          std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](local_10,2);
          bVar1 = cnn::operator!=(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
          if (bVar1) {
            poVar8 = local_350;
            std::__cxx11::ostringstream::ostringstream(poVar8);
            ds = std::operator<<((ostream *)poVar8,"Bad input dimensions in InnerProduct3D_1D: ");
            cnn::operator<<(in_stack_fffffffffffffc40,
                            (vector<cnn::Dim,_std::allocator<cnn::Dim>_> *)ds);
            piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::__cxx11::ostringstream::str();
            std::invalid_argument::invalid_argument(piVar5,local_370);
            __cxa_throw(piVar5,&std::invalid_argument::typeinfo,
                        std::invalid_argument::~invalid_argument);
          }
        }
        return in_RDI;
      }
    }
  }
  poVar8 = local_198;
  std::__cxx11::ostringstream::ostringstream(poVar8);
  std::operator<<((ostream *)poVar8,"Bad input dimensions in InnerProduct3D_1D: ");
  cnn::operator<<(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
  local_1b9 = 1;
  piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::invalid_argument::invalid_argument(piVar5,local_1b8);
  local_1b9 = 0;
  __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Dim InnerProduct3D_1D::dim_forward(const vector<Dim>& xs) const {
  if (xs.size() != 2 && xs.size() != 3)
    throw std::invalid_argument("Expected two or three arguments in InnerProduct3D_1D");
  if (xs[0].ndims() != 3 ||
      xs[1].ndims() != 1 ||
      xs[0].size(2) != xs[1].size(0)) {
    ostringstream s; s << "Bad input dimensions in InnerProduct3D_1D: " << xs;
    throw std::invalid_argument(s.str());
  }
  Dim d({xs[0].size(0), xs[0].size(1)}, max(xs[0].bd, xs[1].bd));
  if(xs.size() == 3) d.bd = max(d.bd, xs[2].bd);
  if (xs.size() == 3 && xs[2] != d) {
    ostringstream s; s << "Bad input dimensions in InnerProduct3D_1D: " << xs;
    throw std::invalid_argument(s.str());
  }
  return d;
}